

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

QVariant * QVariant::fromMetaType(QVariant *__return_storage_ptr__,QMetaType type,void *copy)

{
  undefined1 *puVar1;
  ushort uVar2;
  uint uVar3;
  CopyCtrFn p_Var4;
  PrivateShared *pPVar5;
  ulong uVar6;
  ulong uVar7;
  void *__s;
  int iVar8;
  long in_FS_OFFSET;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  if (type.d_ptr != (QMetaTypeInterface *)0x0) {
    if (((type.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i == 0) {
      QMetaType::registerHelper(type.d_ptr);
    }
    uVar3 = (type.d_ptr)->size;
    uVar6 = (ulong)uVar3;
    if (uVar6 != 0) {
      p_Var4 = (type.d_ptr)->copyCtr;
      if (((p_Var4 == (CopyCtrFn)0x0) && (((type.d_ptr)->flags & 0x4000) != 0)) ||
         (((type.d_ptr)->revision != 0 &&
          (((type.d_ptr)->dtor == (DtorFn)0x0 && (((type.d_ptr)->flags & 2) != 0)))))) {
        local_50.context.version = 2;
        local_50.context._4_8_ = 0;
        local_50.context._12_8_ = 0;
        local_50.context.function._4_4_ = 0;
        local_50.context.category = "default";
        QMessageLogger::warning
                  (&local_50,
                   "QVariant: Provided metatype for \'%s\' does not support destruction and copy construction"
                   ,(type.d_ptr)->name);
      }
      else {
        if (copy == (void *)0x0) {
          if (((type.d_ptr)->defaultCtr == (DefaultCtrFn)0x0) && (((type.d_ptr)->flags & 1) != 0)) {
            local_50.context.version = 2;
            local_50.context._4_8_ = 0;
            local_50.context._12_8_ = 0;
            local_50.context.function._4_4_ = 0;
            local_50.context.category = "default";
            QMessageLogger::warning
                      (&local_50,"QVariant: Cannot create type \'%s\' without a default constructor"
                       ,(type.d_ptr)->name);
            goto LAB_002cd12c;
          }
          (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
          uVar7 = 2;
        }
        else {
          (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
          *(ulong *)&(__return_storage_ptr__->d).field_0x18 = (ulong)type.d_ptr & 0xfffffffffffffffc
          ;
          uVar7 = (ulong)((uint)(((type.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i ==
                                0x33) * 2);
        }
        *(ulong *)&(__return_storage_ptr__->d).field_0x18 =
             (ulong)type.d_ptr & 0xfffffffffffffffc | uVar7;
        uVar2 = (type.d_ptr)->alignment;
        if (((uVar2 < 9 && uVar3 < 0x19) & ((byte)(type.d_ptr)->flags & 4) >> 2) == 1) {
          if (copy == (void *)0x0) {
            if ((type.d_ptr)->defaultCtr != (DefaultCtrFn)0x0) {
              (*(type.d_ptr)->defaultCtr)(type.d_ptr,__return_storage_ptr__);
            }
          }
          else {
            if (p_Var4 == (CopyCtrFn)0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
                __memcpy_chk(__return_storage_ptr__,copy,uVar6,0x20);
                return __return_storage_ptr__;
              }
              goto LAB_002cd18b;
            }
            (*p_Var4)(type.d_ptr,__return_storage_ptr__,copy);
          }
        }
        else {
          uVar7 = 8;
          if (8 < (ulong)uVar2) {
            uVar7 = (ulong)uVar2;
          }
          pPVar5 = (PrivateShared *)operator_new(uVar7 + uVar6);
          iVar8 = (-(uint)uVar2 & (int)pPVar5 + (uint)uVar2 + 7) - (int)pPVar5;
          __s = (void *)((long)&(pPVar5->ref).super_QAtomicInteger<int>.
                                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
                                _M_i + (long)iVar8);
          (pPVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int> = (__atomic_base<int>)0x1;
          pPVar5->offset = iVar8;
          if (copy == (void *)0x0) {
            if ((type.d_ptr)->defaultCtr == (DefaultCtrFn)0x0) {
              memset(__s,0,(ulong)(type.d_ptr)->size);
            }
            else {
              (*(type.d_ptr)->defaultCtr)(type.d_ptr,__s);
            }
          }
          else if ((type.d_ptr)->copyCtr == (CopyCtrFn)0x0) {
            memcpy(__s,copy,(ulong)(type.d_ptr)->size);
          }
          else {
            (*(type.d_ptr)->copyCtr)(type.d_ptr,__s,copy);
          }
          (__return_storage_ptr__->d).data.shared = pPVar5;
          puVar1 = &(__return_storage_ptr__->d).field_0x18;
          *puVar1 = *puVar1 | 1;
        }
      }
    }
  }
LAB_002cd12c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_002cd18b:
  __stack_chk_fail();
}

Assistant:

QVariant QVariant::fromMetaType(QMetaType type, const void *copy)
{
    QVariant result;
    type.registerType();
    const auto iface = type.iface();
    if (isValidMetaTypeForVariant(iface, copy)) {
        result.d = Private(iface);
        customConstruct(iface, &result.d, copy);
    }
    return result;
}